

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.cpp
# Opt level: O2

void __thiscall luna::ModuleManager::LoadString(ModuleManager *this,string *str,string *name)

{
  State *this_00;
  String *module;
  InStringStream is;
  Lexer lexer;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  InStringStream local_a8;
  Lexer local_80;
  
  io::text::InStringStream::InStringStream(&local_a8,str);
  this_00 = this->state_;
  module = State::GetString(this_00,name);
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:51:21)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/ModuleManager.cpp:51:21)>
             ::_M_manager;
  local_c8._M_unused._M_object = &local_a8;
  Lexer::Lexer(&local_80,this_00,module,(CharInStream *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  Load(this,&local_80);
  Lexer::~Lexer(&local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void ModuleManager::LoadString(const std::string &str, const std::string &name)
    {
        io::text::InStringStream is(str);
        Lexer lexer(state_, state_->GetString(name),
                    [&is] () { return is.GetChar(); });
        Load(lexer);
    }